

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O0

void __thiscall spv::Function::setDebugLineInfo(Function *this,Id fileName,int line,int column)

{
  Instruction *this_00;
  pointer pIVar1;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_28;
  uint local_1c;
  uint local_18;
  int column_local;
  int line_local;
  Id fileName_local;
  Function *this_local;
  
  local_1c = column;
  local_18 = line;
  column_local = fileName;
  _line_local = this;
  this_00 = (Instruction *)::operator_new(0x60);
  spv::Instruction::Instruction(this_00,OpLine);
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_28,this_00
            );
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator=
            (&this->lineInstruction,&local_28);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_28);
  pIVar1 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&this->lineInstruction);
  spv::Instruction::reserveOperands(pIVar1,3);
  pIVar1 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&this->lineInstruction);
  spv::Instruction::addIdOperand(pIVar1,column_local);
  pIVar1 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&this->lineInstruction);
  spv::Instruction::addImmediateOperand(pIVar1,local_18);
  pIVar1 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&this->lineInstruction);
  spv::Instruction::addImmediateOperand(pIVar1,local_1c);
  return;
}

Assistant:

void setDebugLineInfo(Id fileName, int line, int column) {
        lineInstruction = std::unique_ptr<Instruction>{new Instruction(OpLine)};
        lineInstruction->reserveOperands(3);
        lineInstruction->addIdOperand(fileName);
        lineInstruction->addImmediateOperand(line);
        lineInstruction->addImmediateOperand(column);
    }